

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

int LoadBuildProduct(TCascStorage *hs,char *param_2,char *szDataBegin,char *szDataEnd,void *param_5)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    if (lVar2 == 0xb8) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascFiles.cpp"
                    ,0x1d4,
                    "int LoadBuildProduct(TCascStorage *, const char *, const char *, const char *, void *)"
                   );
    }
    if ((long)szDataEnd - (long)szDataBegin ==
        *(size_t *)((long)&LocaleStrings[0xf].dwLocale + lVar2)) {
      iVar1 = strncasecmp(szDataBegin,*(char **)((long)&LocaleStrings[0xf].szLocale + lVar2),
                          (long)szDataEnd - (long)szDataBegin);
      if (iVar1 == 0) {
        hs->dwGameInfo = *(DWORD *)((long)&GameIds[0].szGameInfo + lVar2);
        return 0;
      }
    }
    lVar2 = lVar2 + 0x18;
  } while( true );
}

Assistant:

static int LoadBuildProduct(TCascStorage * hs, const char * /* szVariableName */, const char * szDataBegin, const char * szDataEnd, void * /* pvParam */)
{
    // Go through all games that we support
    for(size_t i = 0; GameIds[i].szGameInfo != NULL; i++)
    {
        // Check the length of the variable
        if((size_t)(szDataEnd - szDataBegin) == GameIds[i].cchGameInfo)
        {
            // Check the string
            if(!_strnicmp(szDataBegin, GameIds[i].szGameInfo, GameIds[i].cchGameInfo))
            {
                hs->dwGameInfo = GameIds[i].dwGameInfo;
                return ERROR_SUCCESS;
            }
        }
    }

    // Unknown/unsupported game
    assert(false);
    return ERROR_BAD_FORMAT;
}